

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int cmp_objects(Object *first,Object *second)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  
  if (second->type != OBJ_STRING || first->type != OBJ_STRING) {
    return 1;
  }
  if (first != second) {
    uVar1._0_1_ = first[1].marked;
    uVar1._1_3_ = *(undefined3 *)&first[1].field_0x1;
    uVar1._4_4_ = first[1].type;
    __n._0_1_ = second[1].marked;
    __n._1_3_ = *(undefined3 *)&second[1].field_0x1;
    __n._4_4_ = second[1].type;
    if (uVar1 < __n) {
      __n = uVar1;
    }
    iVar2 = memcmp(first[1].next,second[1].next,__n);
    return iVar2;
  }
  return 0;
}

Assistant:

int cmp_objects(Object *first, Object *second) {
    if (first->type != second->type) {
        return 1;
    }

    switch (first->type) {
        case OBJ_STRING:
            return cmp_strings((ObjString *) first, (ObjString *) second);
        case OBJ_DICT:
            // TODO implement
            break;
        case OBJ_LIST:
            // TODO implement
            break;
        default:
            return 1;
    }

    return 1;
}